

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::NotImplementedException::NotImplementedException<unsigned_long,unsigned_int>
          (NotImplementedException *this,string *msg,unsigned_long params,uint params_1)

{
  undefined4 in_register_0000000c;
  uint in_R8D;
  string local_30;
  
  Exception::ConstructMessage<unsigned_long,unsigned_int>
            (&local_30,(Exception *)msg,(string *)params,CONCAT44(in_register_0000000c,params_1),
             in_R8D);
  NotImplementedException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}